

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O3

void __thiscall adios2::core::ADIOS::ExitComputationBlock(ADIOS *this)

{
  _Rb_tree_node_base *p_Var1;
  
  if (this->enteredComputationBlock == true) {
    this->enteredComputationBlock = false;
    for (p_Var1 = (this->m_IOs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->m_IOs)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      IO::ExitComputationBlock((IO *)(p_Var1 + 2));
    }
  }
  return;
}

Assistant:

void ADIOS::ExitComputationBlock() noexcept
{
    if (enteredComputationBlock)
    {
        enteredComputationBlock = false;
        for (auto &ioPair : m_IOs)
        {
            ioPair.second.ExitComputationBlock();
        }
    }
}